

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::ButtonBehavior
               (ImRect *bb,ImGuiID id,bool *out_hovered,bool *out_held,ImGuiButtonFlags flags)

{
  ImGuiContext *pIVar1;
  byte bVar2;
  bool bVar3;
  ImGuiWindow *window_00;
  undefined1 *in_RCX;
  byte *in_RDX;
  ImGuiID in_ESI;
  uint in_R8D;
  bool bVar4;
  ImVec2 IVar5;
  bool is_repeating_already;
  bool is_double_click_release;
  bool release_anywhere;
  bool release_in;
  int mouse_button;
  bool held;
  bool nav_activated_by_inputs;
  bool nav_activated_by_code;
  bool has_repeated_at_least_once;
  int mouse_button_released;
  int mouse_button_clicked;
  bool hovered;
  bool pressed;
  bool flatten_hovered_children;
  ImGuiWindow *backup_hovered_window;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImVec2 *in_stack_ffffffffffffff88;
  ImGuiHoveredFlags in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffff94;
  ImGuiID id_00;
  byte bVar6;
  undefined1 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff99;
  undefined1 in_stack_ffffffffffffff9a;
  undefined4 in_stack_ffffffffffffff9b;
  undefined1 in_stack_ffffffffffffff9f;
  ImGuiMouseButton in_stack_ffffffffffffffa0;
  undefined1 local_58;
  int local_54;
  undefined4 in_stack_ffffffffffffffb0;
  int iVar7;
  undefined1 in_stack_ffffffffffffffb4;
  byte bVar8;
  ImGuiWindow *window_01;
  uint local_2c;
  bool local_1;
  
  pIVar1 = GImGui;
  window_00 = GetCurrentWindow();
  if ((in_R8D & 0x4000) == 0) {
    local_2c = in_R8D;
    if ((in_R8D & 7) == 0) {
      local_2c = in_R8D | 1;
    }
    if ((local_2c & 0x3f0) == 0) {
      local_2c = local_2c | 0x20;
    }
    window_01 = pIVar1->HoveredWindow;
    id_00 = in_stack_ffffffffffffff94 & 0xffffff;
    if ((local_2c & 0x800) != 0) {
      id_00 = CONCAT13(pIVar1->HoveredRootWindow == window_00,(int3)in_stack_ffffffffffffff94);
    }
    bVar6 = (byte)(id_00 >> 0x18);
    if (bVar6 != 0) {
      pIVar1->HoveredWindow = window_00;
    }
    bVar8 = 0;
    bVar2 = ItemHoverable((ImRect *)
                          CONCAT17(in_stack_ffffffffffffff9f,
                                   CONCAT43(in_stack_ffffffffffffff9b,
                                            CONCAT12(in_stack_ffffffffffffff9a,
                                                     CONCAT11(in_stack_ffffffffffffff99,
                                                              in_stack_ffffffffffffff98)))),id_00);
    if (((((bool)bVar2) && ((pIVar1->DragDropActive & 1U) != 0)) &&
        ((pIVar1->DragDropPayload).SourceId == in_ESI)) && ((pIVar1->DragDropSourceFlags & 2U) == 0)
       ) {
      bVar2 = false;
    }
    if ((((pIVar1->DragDropActive & 1U) != 0) && ((local_2c & 0x200) != 0)) &&
       (((pIVar1->DragDropSourceFlags & 4U) == 0 &&
        (bVar3 = IsItemHovered(in_stack_ffffffffffffff90), bVar3)))) {
      bVar2 = 1;
      SetHoveredID(in_ESI);
      iVar7 = CalcTypematicRepeatAmount
                        ((pIVar1->HoveredIdTimer + 0.0001) - (pIVar1->IO).DeltaTime,
                         pIVar1->HoveredIdTimer + 0.0001,0.7,0.0);
      if (iVar7 != 0) {
        bVar8 = 1;
        pIVar1->DragDropHoldJustPressedId = in_ESI;
        FocusWindow((ImGuiWindow *)
                    CONCAT17(bVar6,CONCAT16(1,CONCAT15(bVar2,CONCAT14(in_stack_ffffffffffffffb4,
                                                                      in_stack_ffffffffffffffb0)))))
        ;
      }
    }
    if ((bVar6 & 1) != 0) {
      pIVar1->HoveredWindow = window_01;
    }
    if ((((bVar2 & 1) != 0) && ((local_2c & 0x1000) != 0)) &&
       ((pIVar1->HoveredIdPreviousFrame != in_ESI && (pIVar1->HoveredIdPreviousFrame != 0)))) {
      bVar2 = 0;
    }
    if ((bVar2 & 1) != 0) {
      if (((local_2c & 0x10000) == 0) ||
         (((((pIVar1->IO).KeyCtrl & 1U) == 0 && (((pIVar1->IO).KeyShift & 1U) == 0)) &&
          (((pIVar1->IO).KeyAlt & 1U) == 0)))) {
        iVar7 = -1;
        local_54 = -1;
        if (((local_2c & 1) == 0) || (((pIVar1->IO).MouseClicked[0] & 1U) == 0)) {
          if (((local_2c & 2) == 0) || (((pIVar1->IO).MouseClicked[1] & 1U) == 0)) {
            if (((local_2c & 4) != 0) && (((pIVar1->IO).MouseClicked[2] & 1U) != 0)) {
              iVar7 = 2;
            }
          }
          else {
            iVar7 = 1;
          }
        }
        else {
          iVar7 = 0;
        }
        if (((local_2c & 1) == 0) || (((pIVar1->IO).MouseReleased[0] & 1U) == 0)) {
          if (((local_2c & 2) == 0) || (((pIVar1->IO).MouseReleased[1] & 1U) == 0)) {
            if (((local_2c & 4) != 0) && (((pIVar1->IO).MouseReleased[2] & 1U) != 0)) {
              local_54 = 2;
            }
          }
          else {
            local_54 = 1;
          }
        }
        else {
          local_54 = 0;
        }
        if ((iVar7 != -1) && (pIVar1->ActiveId != in_ESI)) {
          if ((local_2c & 0x60) != 0) {
            SetActiveID(in_ESI,window_00);
            pIVar1->ActiveIdMouseButton = iVar7;
            if ((local_2c & 0x40000) == 0) {
              SetFocusID((ImGuiID)((ulong)window_00 >> 0x20),window_01);
            }
            FocusWindow((ImGuiWindow *)
                        CONCAT17(bVar6,CONCAT16(bVar8,CONCAT15(bVar2,CONCAT14(
                                                  in_stack_ffffffffffffffb4,iVar7)))));
          }
          if (((local_2c & 0x10) != 0) ||
             (((local_2c & 0x100) != 0 && (((pIVar1->IO).MouseDoubleClicked[iVar7] & 1U) != 0)))) {
            bVar8 = 1;
            if ((local_2c & 0x20000) == 0) {
              SetActiveID(in_ESI,window_00);
            }
            else {
              ClearActiveID();
            }
            pIVar1->ActiveIdMouseButton = iVar7;
            FocusWindow((ImGuiWindow *)
                        CONCAT17(bVar6,CONCAT16(bVar8,CONCAT15(bVar2,CONCAT14(
                                                  in_stack_ffffffffffffffb4,iVar7)))));
          }
        }
        if (((local_2c & 0x80) != 0) && (local_54 != -1)) {
          bVar3 = false;
          if ((local_2c & 0x400) != 0) {
            bVar3 = (pIVar1->IO).KeyRepeatDelay <= (pIVar1->IO).MouseDownDurationPrev[local_54];
          }
          if (!bVar3) {
            bVar8 = 1;
          }
          ClearActiveID();
        }
        if ((((pIVar1->ActiveId == in_ESI) && ((local_2c & 0x400) != 0)) &&
            (0.0 < (pIVar1->IO).MouseDownDuration[pIVar1->ActiveIdMouseButton])) &&
           (bVar3 = IsMouseClicked(in_stack_ffffffffffffffa0,(bool)in_stack_ffffffffffffff9f), bVar3
           )) {
          bVar8 = 1;
        }
      }
      if ((bVar8 & 1) != 0) {
        pIVar1->NavDisableHighlight = true;
      }
    }
    if (((((pIVar1->NavId == in_ESI) && ((pIVar1->NavDisableHighlight & 1U) == 0)) &&
         ((pIVar1->NavDisableMouseHover & 1U) != 0)) &&
        (((pIVar1->ActiveId == 0 || (pIVar1->ActiveId == in_ESI)) ||
         (pIVar1->ActiveId == window_00->MoveId)))) && ((local_2c & 0x80000) == 0)) {
      bVar2 = 1;
    }
    if (pIVar1->NavActivateDownId == in_ESI) {
      bVar4 = pIVar1->NavActivateId == in_ESI;
      bVar3 = IsNavInputTest(0,0x191513);
      if ((bVar4) || (bVar3)) {
        bVar8 = 1;
      }
      if (((bVar4) || (bVar3)) || (pIVar1->ActiveId == in_ESI)) {
        pIVar1->NavActivateId = in_ESI;
        SetActiveID(in_ESI,window_00);
        if (((bVar4) || (bVar3)) && ((local_2c & 0x40000) == 0)) {
          SetFocusID((ImGuiID)((ulong)window_00 >> 0x20),window_01);
        }
      }
    }
    local_58 = 0;
    if (pIVar1->ActiveId == in_ESI) {
      if (pIVar1->ActiveIdSource == ImGuiInputSource_Mouse) {
        if ((pIVar1->ActiveIdIsJustActivated & 1U) != 0) {
          IVar5 = operator-(in_stack_ffffffffffffff88,(ImVec2 *)0x1915e6);
          pIVar1->ActiveIdClickOffset = IVar5;
        }
        iVar7 = pIVar1->ActiveIdMouseButton;
        if (((pIVar1->IO).MouseDown[iVar7] & 1U) == 0) {
          if ((((bVar2 & 1) != 0 && (local_2c & 0x20) != 0) || ((local_2c & 0x40) != 0)) &&
             ((pIVar1->DragDropActive & 1U) == 0)) {
            bVar6 = 0;
            if ((local_2c & 0x100) != 0) {
              bVar6 = (pIVar1->IO).MouseDownWasDoubleClick[iVar7];
            }
            bVar3 = false;
            if ((local_2c & 0x400) != 0) {
              bVar3 = (pIVar1->IO).KeyRepeatDelay <= (pIVar1->IO).MouseDownDurationPrev[iVar7];
            }
            if (((bVar6 & 1) == 0) && (!bVar3)) {
              bVar8 = 1;
            }
          }
          ClearActiveID();
        }
        else {
          local_58 = 1;
        }
        if ((local_2c & 0x40000) == 0) {
          pIVar1->NavDisableHighlight = true;
        }
      }
      else if ((pIVar1->ActiveIdSource == ImGuiInputSource_Nav) &&
              (pIVar1->NavActivateDownId != in_ESI)) {
        ClearActiveID();
      }
      if ((bVar8 & 1) != 0) {
        pIVar1->ActiveIdHasBeenPressedBefore = true;
      }
    }
    if (in_RDX != (byte *)0x0) {
      *in_RDX = bVar2 & 1;
    }
    if (in_RCX != (undefined1 *)0x0) {
      *in_RCX = local_58;
    }
    local_1 = (bool)(bVar8 & 1);
  }
  else {
    if (in_RDX != (byte *)0x0) {
      *in_RDX = 0;
    }
    if (in_RCX != (undefined1 *)0x0) {
      *in_RCX = 0;
    }
    if (pIVar1->ActiveId == in_ESI) {
      ClearActiveID();
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::ButtonBehavior(const ImRect& bb, ImGuiID id, bool* out_hovered, bool* out_held, ImGuiButtonFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    if (flags & ImGuiButtonFlags_Disabled)
    {
        if (out_hovered) *out_hovered = false;
        if (out_held) *out_held = false;
        if (g.ActiveId == id) ClearActiveID();
        return false;
    }

    // Default only reacts to left mouse button
    if ((flags & ImGuiButtonFlags_MouseButtonMask_) == 0)
        flags |= ImGuiButtonFlags_MouseButtonDefault_;

    // Default behavior requires click + release inside bounding box
    if ((flags & ImGuiButtonFlags_PressedOnMask_) == 0)
        flags |= ImGuiButtonFlags_PressedOnDefault_;

    ImGuiWindow* backup_hovered_window = g.HoveredWindow;
    const bool flatten_hovered_children = (flags & ImGuiButtonFlags_FlattenChildren) && g.HoveredRootWindow == window;
    if (flatten_hovered_children)
        g.HoveredWindow = window;

#ifdef IMGUI_ENABLE_TEST_ENGINE
    if (id != 0 && window->DC.LastItemId != id)
        IMGUI_TEST_ENGINE_ITEM_ADD(bb, id);
#endif

    bool pressed = false;
    bool hovered = ItemHoverable(bb, id);

    // Drag source doesn't report as hovered
    if (hovered && g.DragDropActive && g.DragDropPayload.SourceId == id && !(g.DragDropSourceFlags & ImGuiDragDropFlags_SourceNoDisableHover))
        hovered = false;

    // Special mode for Drag and Drop where holding button pressed for a long time while dragging another item triggers the button
    if (g.DragDropActive && (flags & ImGuiButtonFlags_PressedOnDragDropHold) && !(g.DragDropSourceFlags & ImGuiDragDropFlags_SourceNoHoldToOpenOthers))
        if (IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByActiveItem))
        {
            hovered = true;
            SetHoveredID(id);
            if (CalcTypematicRepeatAmount(g.HoveredIdTimer + 0.0001f - g.IO.DeltaTime, g.HoveredIdTimer + 0.0001f, DRAGDROP_HOLD_TO_OPEN_TIMER, 0.00f))
            {
                pressed = true;
                g.DragDropHoldJustPressedId = id;
                FocusWindow(window);
            }
        }

    if (flatten_hovered_children)
        g.HoveredWindow = backup_hovered_window;

    // AllowOverlap mode (rarely used) requires previous frame HoveredId to be null or to match. This allows using patterns where a later submitted widget overlaps a previous one.
    if (hovered && (flags & ImGuiButtonFlags_AllowItemOverlap) && (g.HoveredIdPreviousFrame != id && g.HoveredIdPreviousFrame != 0))
        hovered = false;

    // Mouse handling
    if (hovered)
    {
        if (!(flags & ImGuiButtonFlags_NoKeyModifiers) || (!g.IO.KeyCtrl && !g.IO.KeyShift && !g.IO.KeyAlt))
        {
            // Poll buttons
            int mouse_button_clicked = -1;
            int mouse_button_released = -1;
            if ((flags & ImGuiButtonFlags_MouseButtonLeft) && g.IO.MouseClicked[0])         { mouse_button_clicked = 0; }
            else if ((flags & ImGuiButtonFlags_MouseButtonRight) && g.IO.MouseClicked[1])   { mouse_button_clicked = 1; }
            else if ((flags & ImGuiButtonFlags_MouseButtonMiddle) && g.IO.MouseClicked[2])  { mouse_button_clicked = 2; }
            if ((flags & ImGuiButtonFlags_MouseButtonLeft) && g.IO.MouseReleased[0])        { mouse_button_released = 0; }
            else if ((flags & ImGuiButtonFlags_MouseButtonRight) && g.IO.MouseReleased[1])  { mouse_button_released = 1; }
            else if ((flags & ImGuiButtonFlags_MouseButtonMiddle) && g.IO.MouseReleased[2]) { mouse_button_released = 2; }

            if (mouse_button_clicked != -1 && g.ActiveId != id)
            {
                if (flags & (ImGuiButtonFlags_PressedOnClickRelease | ImGuiButtonFlags_PressedOnClickReleaseAnywhere))
                {
                    SetActiveID(id, window);
                    g.ActiveIdMouseButton = mouse_button_clicked;
                    if (!(flags & ImGuiButtonFlags_NoNavFocus))
                        SetFocusID(id, window);
                    FocusWindow(window);
                }
                if ((flags & ImGuiButtonFlags_PressedOnClick) || ((flags & ImGuiButtonFlags_PressedOnDoubleClick) && g.IO.MouseDoubleClicked[mouse_button_clicked]))
                {
                    pressed = true;
                    if (flags & ImGuiButtonFlags_NoHoldingActiveId)
                        ClearActiveID();
                    else
                        SetActiveID(id, window); // Hold on ID
                    g.ActiveIdMouseButton = mouse_button_clicked;
                    FocusWindow(window);
                }
            }
            if ((flags & ImGuiButtonFlags_PressedOnRelease) && mouse_button_released != -1)
            {
                // Repeat mode trumps on release behavior
                const bool has_repeated_at_least_once = (flags & ImGuiButtonFlags_Repeat) && g.IO.MouseDownDurationPrev[mouse_button_released] >= g.IO.KeyRepeatDelay;
                if (!has_repeated_at_least_once)
                    pressed = true;
                ClearActiveID();
            }

            // 'Repeat' mode acts when held regardless of _PressedOn flags (see table above).
            // Relies on repeat logic of IsMouseClicked() but we may as well do it ourselves if we end up exposing finer RepeatDelay/RepeatRate settings.
            if (g.ActiveId == id && (flags & ImGuiButtonFlags_Repeat))
                if (g.IO.MouseDownDuration[g.ActiveIdMouseButton] > 0.0f && IsMouseClicked(g.ActiveIdMouseButton, true))
                    pressed = true;
        }

        if (pressed)
            g.NavDisableHighlight = true;
    }

    // Gamepad/Keyboard navigation
    // We report navigated item as hovered but we don't set g.HoveredId to not interfere with mouse.
    if (g.NavId == id && !g.NavDisableHighlight && g.NavDisableMouseHover && (g.ActiveId == 0 || g.ActiveId == id || g.ActiveId == window->MoveId))
        if (!(flags & ImGuiButtonFlags_NoHoveredOnFocus))
            hovered = true;
    if (g.NavActivateDownId == id)
    {
        bool nav_activated_by_code = (g.NavActivateId == id);
        bool nav_activated_by_inputs = IsNavInputTest(ImGuiNavInput_Activate, (flags & ImGuiButtonFlags_Repeat) ? ImGuiInputReadMode_Repeat : ImGuiInputReadMode_Pressed);
        if (nav_activated_by_code || nav_activated_by_inputs)
            pressed = true;
        if (nav_activated_by_code || nav_activated_by_inputs || g.ActiveId == id)
        {
            // Set active id so it can be queried by user via IsItemActive(), equivalent of holding the mouse button.
            g.NavActivateId = id; // This is so SetActiveId assign a Nav source
            SetActiveID(id, window);
            if ((nav_activated_by_code || nav_activated_by_inputs) && !(flags & ImGuiButtonFlags_NoNavFocus))
                SetFocusID(id, window);
        }
    }

    // Process while held
    bool held = false;
    if (g.ActiveId == id)
    {
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (g.ActiveIdIsJustActivated)
                g.ActiveIdClickOffset = g.IO.MousePos - bb.Min;

            const int mouse_button = g.ActiveIdMouseButton;
            IM_ASSERT(mouse_button >= 0 && mouse_button < ImGuiMouseButton_COUNT);
            if (g.IO.MouseDown[mouse_button])
            {
                held = true;
            }
            else
            {
                bool release_in = hovered && (flags & ImGuiButtonFlags_PressedOnClickRelease) != 0;
                bool release_anywhere = (flags & ImGuiButtonFlags_PressedOnClickReleaseAnywhere) != 0;
                if ((release_in || release_anywhere) && !g.DragDropActive)
                {
                    // Report as pressed when releasing the mouse (this is the most common path)
                    bool is_double_click_release = (flags & ImGuiButtonFlags_PressedOnDoubleClick) && g.IO.MouseDownWasDoubleClick[mouse_button];
                    bool is_repeating_already = (flags & ImGuiButtonFlags_Repeat) && g.IO.MouseDownDurationPrev[mouse_button] >= g.IO.KeyRepeatDelay; // Repeat mode trumps <on release>
                    if (!is_double_click_release && !is_repeating_already)
                        pressed = true;
                }
                ClearActiveID();
            }
            if (!(flags & ImGuiButtonFlags_NoNavFocus))
                g.NavDisableHighlight = true;
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            // When activated using Nav, we hold on the ActiveID until activation button is released
            if (g.NavActivateDownId != id)
                ClearActiveID();
        }
        if (pressed)
            g.ActiveIdHasBeenPressedBefore = true;
    }

    if (out_hovered) *out_hovered = hovered;
    if (out_held) *out_held = held;

    return pressed;
}